

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_c_coef_controller *pjVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  jpeg_c_coef_controller *pjVar5;
  jpeg_component_info *pjVar6;
  forward_DCT_ptr p_Var7;
  uint uVar8;
  boolean bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  JDIMENSION JVar18;
  uint uVar19;
  int iVar20;
  
  pjVar5 = cinfo->coef;
  JVar2 = cinfo->total_iMCU_rows;
  uVar10 = cinfo->MCUs_per_row - 1;
  iVar15 = *(int *)&pjVar5[1].compress_data;
  pjVar1 = pjVar5 + 2;
  do {
    if (*(int *)((long)&pjVar5[1].compress_data + 4) <= iVar15) {
      *(int *)&pjVar5[1].start_pass = *(int *)&pjVar5[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (uVar19 = *(uint *)((long)&pjVar5[1].start_pass + 4); uVar19 <= uVar10; uVar19 = uVar19 + 1)
    {
      iVar20 = 0;
      for (lVar11 = 0; lVar11 < cinfo->comps_in_scan; lVar11 = lVar11 + 1) {
        pjVar6 = cinfo->cur_comp_info[lVar11];
        p_Var7 = cinfo->fdct->forward_DCT[pjVar6->component_index];
        JVar3 = (&pjVar6->MCU_width)[(ulong)(uVar10 <= uVar19) * 4];
        iVar4 = pjVar6->MCU_sample_width;
        JVar18 = pjVar6->DCT_v_scaled_size * iVar15;
        for (iVar14 = 0; iVar14 < pjVar6->MCU_height; iVar14 = iVar14 + 1) {
          lVar13 = (long)iVar20;
          if ((*(uint *)&pjVar5[1].start_pass < JVar2 - 1) ||
             (iVar15 + iVar14 < pjVar6->last_row_height)) {
            (*p_Var7)(cinfo,pjVar6,input_buf[pjVar6->component_index],
                      (JBLOCKROW)(&pjVar1->start_pass)[lVar13],JVar18,iVar4 * uVar19,JVar3);
            uVar8 = pjVar6->MCU_width;
            if ((int)JVar3 < (int)uVar8) {
              memset((JBLOCKROW)(&pjVar1->start_pass)[(int)(iVar20 + JVar3)],0,
                     (long)(int)(uVar8 - JVar3) << 7);
              uVar8 = pjVar6->MCU_width;
              for (lVar16 = (long)(int)JVar3; lVar16 < (int)uVar8; lVar16 = lVar16 + 1) {
                (*(JBLOCKROW)(&pjVar1->start_pass)[lVar13 + lVar16])[0] =
                     **(JCOEF **)((long)pjVar1 + lVar16 * 8 + lVar13 * 8 + -8);
              }
            }
          }
          else {
            memset((JBLOCKROW)(&pjVar1->start_pass)[lVar13],0,(long)pjVar6->MCU_width << 7);
            uVar8 = pjVar6->MCU_width;
            uVar12 = 0;
            if (0 < (int)uVar8) {
              uVar12 = (ulong)uVar8;
            }
            for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
              (*(JBLOCKROW)(&pjVar1->start_pass)[lVar13 + uVar17])[0] =
                   (*(JBLOCKROW)(&pjVar1->start_pass)[iVar20 + -1])[0];
            }
          }
          iVar20 = iVar20 + uVar8;
          JVar18 = JVar18 + pjVar6->DCT_v_scaled_size;
        }
      }
      bVar9 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)pjVar1);
      if (bVar9 == 0) {
        *(int *)&pjVar5[1].compress_data = iVar15;
        *(uint *)((long)&pjVar5[1].start_pass + 4) = uVar19;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar5[1].start_pass + 4) = 0;
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_data (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;
  forward_DCT_ptr forward_DCT;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	forward_DCT = cinfo->fdct->forward_DCT[compptr->component_index];
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	xpos = MCU_col_num * compptr->MCU_sample_width;
	ypos = yoffset * compptr->DCT_v_scaled_size;
	/* ypos == (yoffset+yindex) * DCTSIZE */
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    (*forward_DCT) (cinfo, compptr,
			    input_buf[compptr->component_index],
			    coef->MCU_buffer[blkn],
			    ypos, xpos, (JDIMENSION) blockcnt);
	    if (blockcnt < compptr->MCU_width) {
	      /* Create some dummy blocks at the right edge of the image. */
	      FMEMZERO((void FAR *) coef->MCU_buffer[blkn + blockcnt],
		       (compptr->MCU_width - blockcnt) * SIZEOF(JBLOCK));
	      for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
		coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn+bi-1][0][0];
	      }
	    }
	  } else {
	    /* Create a row of dummy blocks at the bottom of the image. */
	    FMEMZERO((void FAR *) coef->MCU_buffer[blkn],
		     compptr->MCU_width * SIZEOF(JBLOCK));
	    for (bi = 0; bi < compptr->MCU_width; bi++) {
	      coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn-1][0][0];
	    }
	  }
	  blkn += compptr->MCU_width;
	  ypos += compptr->DCT_v_scaled_size;
	}
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}